

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

int __thiscall
hanabi_learning_env::HanabiGame::NumberCardInstances(HanabiGame *this,int color,int rank)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  HanabiGame *in_RDI;
  
  if ((((in_ESI < 0) || (iVar1 = NumColors(in_RDI), iVar1 <= in_ESI)) || (in_EDX < 0)) ||
     (iVar1 = NumRanks(in_RDI), iVar1 <= in_EDX)) {
    return 0;
  }
  if (in_EDX == 0) {
    return 3;
  }
  iVar1 = NumRanks(in_RDI);
  if (in_EDX == iVar1 + -1) {
    return 1;
  }
  return 2;
}

Assistant:

int HanabiGame::NumberCardInstances(int color, int rank) const {
  if (color < 0 || color >= NumColors() || rank < 0 || rank >= NumRanks()) {
    return 0;
  }
  if (rank == 0) {
    return 3;
  } else if (rank == NumRanks() - 1) {
    return 1;
  }
  return 2;
}